

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

XMLElement * __thiscall
tinyxml2::XMLDocument::CreateUnlinkedNode<tinyxml2::XMLElement,120>
          (XMLDocument *this,MemPoolT<120> *pool)

{
  int iVar1;
  undefined4 extraout_var;
  XMLElement *pXVar2;
  
  iVar1 = (*(pool->super_MemPool)._vptr_MemPool[3])(pool);
  pXVar2 = (XMLElement *)CONCAT44(extraout_var,iVar1);
  (pXVar2->super_XMLNode)._document = this;
  (pXVar2->super_XMLNode)._parent = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._value._flags = 0;
  (pXVar2->super_XMLNode)._value._start = (char *)0x0;
  (pXVar2->super_XMLNode)._value._end = (char *)0x0;
  (pXVar2->super_XMLNode)._parseLineNum = 0;
  (pXVar2->super_XMLNode)._userData = (void *)0x0;
  (pXVar2->super_XMLNode)._memPool = (MemPool *)0x0;
  (pXVar2->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._prev = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._next = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_001a55e0;
  pXVar2->_closingType = OPEN;
  pXVar2->_rootAttribute = (XMLAttribute *)0x0;
  (pXVar2->super_XMLNode)._memPool = &pool->super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
  iVar1 = (this->_unlinked)._size;
  (this->_unlinked)._mem[iVar1] = (XMLNode *)pXVar2;
  (this->_unlinked)._size = iVar1 + 1;
  return pXVar2;
}

Assistant:

inline NodeType* XMLDocument::CreateUnlinkedNode(MemPoolT<PoolElementSize>& pool)
{
    TIXMLASSERT(sizeof(NodeType) == PoolElementSize);
    TIXMLASSERT(sizeof(NodeType) == pool.ItemSize());
    NodeType* returnNode = new (pool.Alloc()) NodeType(this);
    TIXMLASSERT(returnNode);
    returnNode->_memPool = &pool;

    _unlinked.Push(returnNode);
    return returnNode;
}